

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTools.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
Assimp::trim_whitespaces<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,Assimp *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str)

{
  uint uVar1;
  char *pcVar2;
  long lVar3;
  undefined1 local_32;
  undefined1 local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str_local;
  
  while( true ) {
    uVar1 = std::__cxx11::string::empty();
    local_31 = false;
    if ((uVar1 & 1) == 0) {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this);
      local_31 = IsSpace<char>(*pcVar2);
    }
    if (local_31 == false) break;
    std::__cxx11::string::erase((ulong)this,0);
  }
  while( true ) {
    uVar1 = std::__cxx11::string::empty();
    local_32 = false;
    if ((uVar1 & 1) == 0) {
      std::__cxx11::string::length();
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this);
      local_32 = IsSpace<char>(*pcVar2);
    }
    if (local_32 == false) break;
    lVar3 = std::__cxx11::string::length();
    std::__cxx11::string::erase((ulong)this,lVar3 - 1);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  return __return_storage_ptr__;
}

Assistant:

string_type trim_whitespaces(string_type str)
{
    while (!str.empty() && IsSpace(str[0])) str.erase(0);
    while (!str.empty() && IsSpace(str[str.length() - 1])) str.erase(str.length() - 1);
    return str;
}